

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_rdmsr_x86_64(CPUX86State *env)

{
  uint uVar1;
  uint64_t uVar2;
  uintptr_t unaff_retaddr;
  
  uVar2 = 0;
  cpu_svm_check_intercept_param_x86_64(env,0x7c,0,unaff_retaddr);
  uVar1 = (uint)env->regs[1];
  if (uVar1 - 0x200 < 0x10) {
    if ((0x5555U >> (uVar1 - 0x200 & 0x1f) & 1) == 0) {
      uVar2 = env->mtrr_var[uVar1 - 0x201 >> 1].mask;
    }
    else {
      uVar2 = env->mtrr_var[uVar1 - 0x200 >> 1].base;
    }
    goto LAB_004d548a;
  }
  if (uVar1 - 0x268 < 8) {
    uVar1 = uVar1 - 0x265;
LAB_004d546d:
    uVar2 = env->mtrr_fixed[uVar1];
    goto LAB_004d548a;
  }
  switch(uVar1) {
  case 0x174:
    uVar2 = (uint64_t)env->sysenter_cs;
    break;
  case 0x175:
    uVar2 = env->sysenter_esp;
    break;
  case 0x176:
    uVar2 = env->sysenter_eip;
    break;
  case 0x177:
  case 0x178:
switchD_004d54ae_caseD_177:
    if ((0x3ff < uVar1) && (uVar1 < ((uint)env->mcg_cap & 0x3f) * 4 + 0x400)) {
      uVar2 = env->mce_banks[uVar1 - 0x400];
      break;
    }
    goto LAB_004d5563;
  case 0x179:
    uVar2 = env->mcg_cap;
    break;
  case 0x17a:
    uVar2 = env->mcg_status;
    break;
  case 0x17b:
    if ((env->mcg_cap & 0x100) != 0) {
      uVar2 = env->mcg_ctl;
      break;
    }
LAB_004d5563:
    uVar2 = 0;
    break;
  default:
    switch(uVar1) {
    case 0xc0000080:
      uVar2 = env->efer;
      break;
    case 0xc0000081:
      uVar2 = env->star;
      break;
    case 0xc0000082:
      uVar2 = env->lstar;
      break;
    case 0xc0000083:
      uVar2 = env->cstar;
      break;
    case 0xc0000084:
      uVar2 = env->fmask;
      break;
    default:
      switch(uVar1) {
      case 0xc0000100:
        uVar2 = env->segs[4].base;
        break;
      case 0xc0000101:
        uVar2 = env->segs[5].base;
        break;
      case 0xc0000102:
        uVar2 = env->kernelgsbase;
        break;
      case 0xc0000103:
        uVar2 = env->tsc_aux;
        break;
      default:
        if (uVar1 - 600 < 2) {
          uVar1 = uVar1 - 599;
          goto LAB_004d546d;
        }
        if (uVar1 == 0xc0010117) {
          uVar2 = env->vm_hsave;
          break;
        }
        if (uVar1 == 0x1b) break;
        if (uVar1 == 0x34) {
          uVar2 = env->msr_smi_count;
          break;
        }
        if (uVar1 == 0x8b) {
          uVar2 = env[1].regs[0];
          break;
        }
        if (uVar1 == 0xfe) {
          uVar2 = (uint64_t)((uint)((long)(env->features[0] << 0x33) >> 0x3f) & 0x508);
          break;
        }
        if (uVar1 == 0x198) {
          uVar2 = 0x400000003e8;
          break;
        }
        if (uVar1 == 0x1a0) {
          uVar2 = env->msr_ia32_misc_enable;
          break;
        }
        if (uVar1 == 0x250) {
          uVar2 = env->mtrr_fixed[0];
          break;
        }
        if (uVar1 == 0x277) {
          uVar2 = env->pat;
          break;
        }
        if (uVar1 == 0x2ff) {
          uVar2 = env->mtrr_deftype;
          break;
        }
        if (uVar1 == 0xd90) {
          uVar2 = env->msr_bndcfgs;
          break;
        }
        goto switchD_004d54ae_caseD_177;
      }
    }
  }
LAB_004d548a:
  env->regs[0] = uVar2 & 0xffffffff;
  env->regs[2] = uVar2 >> 0x20;
  return;
}

Assistant:

void helper_rdmsr(CPUX86State *env)
{
    X86CPU *x86_cpu = env_archcpu(env);
    uint64_t val;

    cpu_svm_check_intercept_param(env, SVM_EXIT_MSR, 0, GETPC());

    switch ((uint32_t)env->regs[R_ECX]) {
    case MSR_IA32_SYSENTER_CS:
        val = env->sysenter_cs;
        break;
    case MSR_IA32_SYSENTER_ESP:
        val = env->sysenter_esp;
        break;
    case MSR_IA32_SYSENTER_EIP:
        val = env->sysenter_eip;
        break;
    case MSR_IA32_APICBASE:
        val = 0; // cpu_get_apic_base(env_archcpu(env)->apic_state);
        break;
    case MSR_EFER:
        val = env->efer;
        break;
    case MSR_STAR:
        val = env->star;
        break;
    case MSR_PAT:
        val = env->pat;
        break;
    case MSR_VM_HSAVE_PA:
        val = env->vm_hsave;
        break;
    case MSR_IA32_PERF_STATUS:
        /* tsc_increment_by_tick */
        val = 1000ULL;
        /* CPU multiplier */
        val |= (((uint64_t)4ULL) << 40);
        break;
#ifdef TARGET_X86_64
    case MSR_LSTAR:
        val = env->lstar;
        break;
    case MSR_CSTAR:
        val = env->cstar;
        break;
    case MSR_FMASK:
        val = env->fmask;
        break;
    case MSR_FSBASE:
        val = env->segs[R_FS].base;
        break;
    case MSR_GSBASE:
        val = env->segs[R_GS].base;
        break;
    case MSR_KERNELGSBASE:
        val = env->kernelgsbase;
        break;
    case MSR_TSC_AUX:
        val = env->tsc_aux;
        break;
#endif
    case MSR_SMI_COUNT:
        val = env->msr_smi_count;
        break;
    case MSR_MTRRphysBase(0):
    case MSR_MTRRphysBase(1):
    case MSR_MTRRphysBase(2):
    case MSR_MTRRphysBase(3):
    case MSR_MTRRphysBase(4):
    case MSR_MTRRphysBase(5):
    case MSR_MTRRphysBase(6):
    case MSR_MTRRphysBase(7):
        val = env->mtrr_var[((uint32_t)env->regs[R_ECX] -
                             MSR_MTRRphysBase(0)) / 2].base;
        break;
    case MSR_MTRRphysMask(0):
    case MSR_MTRRphysMask(1):
    case MSR_MTRRphysMask(2):
    case MSR_MTRRphysMask(3):
    case MSR_MTRRphysMask(4):
    case MSR_MTRRphysMask(5):
    case MSR_MTRRphysMask(6):
    case MSR_MTRRphysMask(7):
        val = env->mtrr_var[((uint32_t)env->regs[R_ECX] -
                             MSR_MTRRphysMask(0)) / 2].mask;
        break;
    case MSR_MTRRfix64K_00000:
        val = env->mtrr_fixed[0];
        break;
    case MSR_MTRRfix16K_80000:
    case MSR_MTRRfix16K_A0000:
        val = env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                              MSR_MTRRfix16K_80000 + 1];
        break;
    case MSR_MTRRfix4K_C0000:
    case MSR_MTRRfix4K_C8000:
    case MSR_MTRRfix4K_D0000:
    case MSR_MTRRfix4K_D8000:
    case MSR_MTRRfix4K_E0000:
    case MSR_MTRRfix4K_E8000:
    case MSR_MTRRfix4K_F0000:
    case MSR_MTRRfix4K_F8000:
        val = env->mtrr_fixed[(uint32_t)env->regs[R_ECX] -
                              MSR_MTRRfix4K_C0000 + 3];
        break;
    case MSR_MTRRdefType:
        val = env->mtrr_deftype;
        break;
    case MSR_MTRRcap:
        if (env->features[FEAT_1_EDX] & CPUID_MTRR) {
            val = MSR_MTRRcap_VCNT | MSR_MTRRcap_FIXRANGE_SUPPORT |
                MSR_MTRRcap_WC_SUPPORTED;
        } else {
            /* XXX: exception? */
            val = 0;
        }
        break;
    case MSR_MCG_CAP:
        val = env->mcg_cap;
        break;
    case MSR_MCG_CTL:
        if (env->mcg_cap & MCG_CTL_P) {
            val = env->mcg_ctl;
        } else {
            val = 0;
        }
        break;
    case MSR_MCG_STATUS:
        val = env->mcg_status;
        break;
    case MSR_IA32_MISC_ENABLE:
        val = env->msr_ia32_misc_enable;
        break;
    case MSR_IA32_BNDCFGS:
        val = env->msr_bndcfgs;
        break;
     case MSR_IA32_UCODE_REV:
        val = x86_cpu->ucode_rev;
        break;
    default:
        if ((uint32_t)env->regs[R_ECX] >= MSR_MC0_CTL
            && (uint32_t)env->regs[R_ECX] < MSR_MC0_CTL +
            (4 * env->mcg_cap & 0xff)) {
            uint32_t offset = (uint32_t)env->regs[R_ECX] - MSR_MC0_CTL;
            val = env->mce_banks[offset];
            break;
        }
        /* XXX: exception? */
        val = 0;
        break;
    }
    env->regs[R_EAX] = (uint32_t)(val);
    env->regs[R_EDX] = (uint32_t)(val >> 32);
}